

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1274:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
          *this,Descriptor *descriptor)

{
  EnumDescriptor *this_00;
  FieldDescriptor *pFVar1;
  Descriptor *descriptor_00;
  int i;
  uint index;
  int iVar2;
  EnumDescriptor *descriptor_01;
  
  for (index = 0; (int)index < descriptor->enum_type_count_; index = index + 1) {
    descriptor_01 = (EnumDescriptor *)(ulong)index;
    this_00 = Descriptor::enum_type(descriptor,index);
    Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
             *)this_00,descriptor_01);
  }
  for (iVar2 = 0; iVar2 < descriptor->oneof_decl_count_; iVar2 = iVar2 + 1) {
    Descriptor::oneof_decl(descriptor,iVar2);
  }
  for (iVar2 = 0; iVar2 < descriptor->field_count_; iVar2 = iVar2 + 1) {
    pFVar1 = Descriptor::field(descriptor,iVar2);
    Visit<>(this,pFVar1);
  }
  for (iVar2 = 0; iVar2 < descriptor->nested_type_count_; iVar2 = iVar2 + 1) {
    descriptor_00 = Descriptor::nested_type(descriptor,iVar2);
    Visit<>(this,descriptor_00);
  }
  for (iVar2 = 0; iVar2 < descriptor->extension_count_; iVar2 = iVar2 + 1) {
    pFVar1 = Descriptor::extension(descriptor,iVar2);
    Visit<>(this,pFVar1);
  }
  for (iVar2 = 0; iVar2 < descriptor->extension_range_count_; iVar2 = iVar2 + 1) {
    Descriptor::extension_range(descriptor,iVar2);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }